

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O3

void __thiscall APowerInvulnerable::DoEffect(APowerInvulnerable *this)

{
  byte *pbVar1;
  AActor *pAVar2;
  int iVar3;
  double dVar4;
  
  APowerup::DoEffect(&this->super_APowerup);
  pAVar2 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
  if (pAVar2 != (AActor *)0x0) {
    if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      if ((this->super_APowerup).Mode.super_FName.Index == 0x11) {
        if (((pAVar2->flags).Value & 0x40000) == 0) {
          pAVar2->RenderStyle = LegacyRenderStyles[6];
          iVar3 = level.time;
          if ((level.time & 7U) == 0) {
            pAVar2 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
            dVar4 = pAVar2->Alpha;
            if ((0.0 < dVar4) && (dVar4 < 1.0)) {
              if ((dVar4 != 0.59375) || (NAN(dVar4))) {
                pAVar2->Alpha = 0.0;
                pbVar1 = (byte *)((long)&(pAVar2->flags2).Value + 3);
                *pbVar1 = *pbVar1 | 4;
              }
              else {
                pAVar2->Alpha = 0.40625;
              }
            }
          }
          if ((iVar3 & 0x1fU) == 0) {
            pAVar2 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
            if ((pAVar2->Alpha != 0.0) || (NAN(pAVar2->Alpha))) {
              dVar4 = 0.59375;
            }
            else {
              pbVar1 = (byte *)((long)&(pAVar2->flags2).Value + 3);
              *pbVar1 = *pbVar1 & 0xfb;
              dVar4 = 0.40625;
            }
            pAVar2->Alpha = dVar4;
          }
        }
        else {
          pbVar1 = (byte *)((long)&(pAVar2->flags2).Value + 3);
          *pbVar1 = *pbVar1 & 0xfb;
        }
      }
    }
    else {
      (this->super_APowerup).super_AInventory.Owner.field_0.p = (AActor *)0x0;
    }
  }
  return;
}

Assistant:

void APowerInvulnerable::DoEffect ()
{
	Super::DoEffect ();

	if (Owner == NULL)
	{
		return;
	}

	if (Mode == NAME_Ghost)
	{
		if (!(Owner->flags & MF_SHADOW))
		{
			// Don't mess with the translucency settings if an
			// invisibility powerup is active.
			Owner->RenderStyle = STYLE_Translucent;
			if (!(level.time & 7) && Owner->Alpha > 0 && Owner->Alpha < 1)
			{
				if (Owner->Alpha == HX_SHADOW)
				{
					Owner->Alpha = HX_ALTSHADOW;
				}
				else
				{
					Owner->Alpha = 0;
					Owner->flags2 |= MF2_NONSHOOTABLE;
				}
			}
			if (!(level.time & 31))
			{
				if (Owner->Alpha == 0)
				{
					Owner->flags2 &= ~MF2_NONSHOOTABLE;
					Owner->Alpha = HX_ALTSHADOW;
				}
				else
				{
					Owner->Alpha = HX_SHADOW;
				}
			}
		}
		else
		{
			Owner->flags2 &= ~MF2_NONSHOOTABLE;
		}
	}
}